

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Address __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getFinalAddressWithoutOffset
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Literal *ptr,Index bytes,Address memorySize)

{
  uintptr_t uVar1;
  uint64_t lhs;
  
  uVar1 = (ptr->type).id;
  if (uVar1 == 3) {
    lhs = (ptr->field_0).func.super_IString.str._M_len;
  }
  else {
    if (uVar1 != 2) {
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x129,"int64_t wasm::Literal::geti64() const");
    }
    lhs = (uint64_t)(ptr->field_0).i32;
  }
  trapIfGt(this,lhs,memorySize.addr * 0x10000 - (ulong)bytes,"highest > memory");
  return (Address)lhs;
}

Assistant:

Address
  getFinalAddressWithoutOffset(Literal ptr, Index bytes, Address memorySize) {
    uint64_t addr = ptr.type == Type::i32 ? ptr.geti32() : ptr.geti64();
    checkLoadAddress(addr, bytes, memorySize);
    return addr;
  }